

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbi_write_tga_core(stbi__write_context *s,int x,int y,int comp,void *data)

{
  stbi__write_context *s_00;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  void *pvVar6;
  undefined4 in_register_00000034;
  uchar *d;
  size_t __n;
  void *__s1;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  ulong in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffef8;
  uchar header;
  uchar header_1;
  stbi__write_context *local_98;
  int local_8c;
  long local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  long local_68;
  int local_5c;
  void *local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar5 = (ulong)(uint)comp;
  uVar4 = (uint)((comp - 2U & 0xfffffffd) == 0);
  local_78 = (ulong)uVar4;
  iVar1 = comp - uVar4;
  if ((y | x) < 0) {
    iVar1 = 0;
  }
  else {
    uVar8 = (ulong)(uint)x;
    local_98 = s;
    local_58 = data;
    if (stbi_write_tga_with_rle == 0) {
      iVar1 = stbiw__outfile(s,x,uVar4,x,y,comp,0,data,uVar4,0,"111 221 2222 11",0,0,iVar1 < 2 | 2,0
                             ,0,0,0,0,x,y,(iVar1 + uVar4) * 8,uVar4 * 8);
    }
    else {
      d = (uchar *)0x0;
      stbiw__writef(s,(char *)CONCAT44(in_register_00000034,x),0,0,(ulong)(iVar1 < 2 | 10),0,0,
                    in_stack_fffffffffffffee0 & 0xffffffff00000000,0,0,
                    CONCAT44((int)((ulong)in_stack_fffffffffffffef8 >> 0x20),x),y,
                    (iVar1 + uVar4) * 8,uVar4 * 8);
      local_8c = comp * x;
      local_5c = x + -1;
      __n = (size_t)comp;
      local_48 = (long)x;
      local_38 = (long)y;
      iVar3 = (y + -1) * local_8c;
      local_80 = uVar8;
      local_70 = uVar5;
      while (iVar1 = 1, 0 < local_38) {
        local_88 = (long)iVar3;
        local_38 = local_38 + -1;
        local_40 = (long)(local_8c * (int)local_38) + (long)local_58;
        local_68 = local_88 + (long)local_58;
        local_50 = 0;
        while (iVar1 = (int)local_50, iVar1 < (int)uVar8) {
          iVar3 = (int)uVar5;
          uVar4 = 1;
          if (iVar1 < local_5c) {
            __s1 = (void *)(local_40 + iVar1 * iVar3);
            iVar2 = bcmp(__s1,(void *)((iVar1 + 1) * iVar3 + local_40),__n);
            lVar9 = (long)(iVar1 + 2);
            if (iVar2 != 0) {
              pvVar6 = (void *)(__n * lVar9 + local_68);
              uVar4 = 2;
              while( true ) {
                uVar5 = local_70;
                uVar8 = local_80;
                if ((local_48 <= lVar9) || (0x7f < uVar4)) goto LAB_00111fbb;
                iVar2 = bcmp(__s1,pvVar6,__n);
                if (iVar2 == 0) break;
                __s1 = (void *)((long)__s1 + __n);
                uVar4 = uVar4 + 1;
                lVar9 = lVar9 + 1;
                pvVar6 = (void *)((long)pvVar6 + __n);
              }
              uVar4 = uVar4 - 1;
              uVar5 = local_70;
              uVar8 = local_80;
              goto LAB_00111fbb;
            }
            pvVar6 = (void *)(__n * lVar9 + local_68);
            uVar4 = 2;
            while (((lVar9 < local_48 && (uVar4 < 0x80)) &&
                   (iVar1 = bcmp(__s1,pvVar6,__n), iVar1 == 0))) {
              uVar4 = uVar4 + 1;
              lVar9 = lVar9 + 1;
              pvVar6 = (void *)((long)pvVar6 + __n);
            }
            s_00 = local_98;
            header = (char)uVar4 + '\x7f';
            (*local_98->func)(local_98->context,&header,1);
            stbiw__write_pixel(s_00,iVar3,(int)local_78,0,(int)__s1,d);
            uVar8 = local_80;
          }
          else {
LAB_00111fbb:
            header_1 = (char)uVar4 + 0xff;
            (*local_98->func)(local_98->context,&header_1,1);
            uVar7 = (ulong)uVar4;
            lVar9 = iVar1 * iVar3 + local_68;
            while (bVar10 = uVar7 != 0, uVar7 = uVar7 - 1, bVar10) {
              stbiw__write_pixel(local_98,(int)uVar5,(int)local_78,0,(int)lVar9,d);
              lVar9 = lVar9 + __n;
            }
          }
          local_50 = (ulong)(uVar4 + (int)local_50);
        }
        iVar3 = (int)local_88 - local_8c;
      }
    }
  }
  return iVar1;
}

Assistant:

static int stbi_write_tga_core(stbi__write_context *s, int x, int y, int comp, void *data)
{
   int has_alpha = (comp == 2 || comp == 4);
   int colorbytes = has_alpha ? comp-1 : comp;
   int format = colorbytes < 2 ? 3 : 2; // 3 color channels (RGB/RGBA) = 2, 1 color channel (Y/YA) = 3

   if (y < 0 || x < 0)
      return 0;

   if (!stbi_write_tga_with_rle) {
      return stbiw__outfile(s, -1, -1, x, y, comp, 0, (void *) data, has_alpha, 0,
         "111 221 2222 11", 0, 0, format, 0, 0, 0, 0, 0, x, y, (colorbytes + has_alpha) * 8, has_alpha * 8);
   } else {
      int i,j,k;

      stbiw__writef(s, "111 221 2222 11", 0,0,format+8, 0,0,0, 0,0,x,y, (colorbytes + has_alpha) * 8, has_alpha * 8);

      for (j = y - 1; j >= 0; --j) {
          unsigned char *row = (unsigned char *) data + j * x * comp;
         int len;

         for (i = 0; i < x; i += len) {
            unsigned char *begin = row + i * comp;
            int diff = 1;
            len = 1;

            if (i < x - 1) {
               ++len;
               diff = memcmp(begin, row + (i + 1) * comp, comp);
               if (diff) {
                  const unsigned char *prev = begin;
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (memcmp(prev, row + k * comp, comp)) {
                        prev += comp;
                        ++len;
                     } else {
                        --len;
                        break;
                     }
                  }
               } else {
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (!memcmp(begin, row + k * comp, comp)) {
                        ++len;
                     } else {
                        break;
                     }
                  }
               }
            }

            if (diff) {
               unsigned char header = STBIW_UCHAR(len - 1);
               s->func(s->context, &header, 1);
               for (k = 0; k < len; ++k) {
                  stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin + k * comp);
               }
            } else {
               unsigned char header = STBIW_UCHAR(len - 129);
               s->func(s->context, &header, 1);
               stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin);
            }
         }
      }
   }
   return 1;
}